

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

bool __thiscall
cmsys::SystemInformationImplementation::QueryLinuxMemory(SystemInformationImplementation *this)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  FILE *__stream;
  uint uVar7;
  bool bVar8;
  long lVar9;
  unsigned_long *puVar10;
  unsigned_long *puVar11;
  unsigned_long cachedMem;
  unsigned_long ap;
  unsigned_long av;
  unsigned_long tp;
  unsigned_long tv;
  SystemInformationImplementation *local_610;
  FILE *local_608;
  unsigned_long buffersMem;
  unsigned_long temp;
  long local_5f0;
  long local_5e8;
  long local_5e0;
  ulong local_5d8;
  ulong uStack_5d0;
  utsname unameInfo;
  char buffer [1024];
  
  tv = 0;
  tp = 0;
  av = 0;
  ap = 0;
  iVar1 = uname((utsname *)&unameInfo);
  if (iVar1 == 0) {
    sVar6 = strlen(unameInfo.release);
    bVar8 = false;
    uVar7 = 0;
    if (2 < sVar6) {
      uVar7 = 0;
      if ((int)unameInfo.release[0] - 0x30U < 10) {
        uVar7 = (int)unameInfo.release[0] - 0x30U;
      }
      bVar8 = '5' < unameInfo.release[2] && (int)unameInfo.release[2] - 0x30U < 10;
    }
    __stream = fopen64("/proc/meminfo","r");
    if (__stream != (FILE *)0x0) {
      if ((2 < (int)uVar7) || ((bool)(uVar7 == 2 & bVar8))) {
        cachedMem._4_2_ = 0;
        cachedMem._0_4_ = 0;
        iVar1 = 0;
        local_610 = this;
        local_608 = __stream;
        while (__stream = local_608, pcVar5 = fgets(buffer,0x400,local_608), pcVar5 != (char *)0x0)
        {
          puVar10 = &temp;
          puVar11 = &cachedMem;
          for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 4) {
            if ((*(char *)puVar11 == '\0') &&
               (iVar2 = __isoc99_sscanf(buffer,(long)&DAT_00555450 +
                                               (long)*(int *)((long)&DAT_00555450 + lVar9),puVar10),
               iVar2 == 1)) {
              *(char *)puVar11 = '\x01';
              iVar1 = iVar1 + 1;
            }
            puVar10 = puVar10 + 1;
            puVar11 = (unsigned_long *)((long)puVar11 + 1);
          }
        }
        if (iVar1 == 6) {
          local_610->TotalPhysicalMemory = temp >> 10;
          local_610->AvailablePhysicalMemory = (ulong)(local_5e8 + local_5f0 + local_5e0) >> 10;
          local_610->TotalVirtualMemory = local_5d8 >> 10;
          local_610->AvailableVirtualMemory = uStack_5d0 >> 10;
LAB_00469134:
          fclose(__stream);
          return true;
        }
      }
      else {
        pcVar5 = fgets(buffer,0x400,__stream);
        if (pcVar5 == buffer) {
          iVar1 = __isoc99_fscanf(__stream,"Mem: %lu %lu %lu %lu %lu %lu\n",&tp,&temp,&ap,&temp,
                                  &buffersMem,&cachedMem);
          if (iVar1 == 6) {
            iVar1 = __isoc99_fscanf(__stream,"Swap: %lu %lu %lu\n",&tv,&temp,&av);
            iVar1 = iVar1 + 6;
          }
          if (iVar1 == 9) {
            this->TotalVirtualMemory = tv >> 0x14;
            this->TotalPhysicalMemory = tp >> 0x14;
            this->AvailableVirtualMemory = av >> 0x14;
            this->AvailablePhysicalMemory =
                 buffersMem + ap +
                 CONCAT26(cachedMem._6_2_,CONCAT24(cachedMem._4_2_,(undefined4)cachedMem)) >> 0x14;
            goto LAB_00469134;
          }
        }
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"Problem parsing /proc/meminfo");
      std::endl<char,std::char_traits<char>>(poVar3);
      fclose(__stream);
      return false;
    }
    poVar3 = (ostream *)&std::cout;
    pcVar5 = "Problem opening /proc/meminfo";
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Problem calling uname(): ");
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  return false;
}

Assistant:

bool SystemInformationImplementation::QueryLinuxMemory()
{
#if defined(__linux)
  unsigned long tv=0;
  unsigned long tp=0;
  unsigned long av=0;
  unsigned long ap=0;

  char buffer[1024]; // for reading lines

  int linuxMajor = 0;
  int linuxMinor = 0;

  // Find the Linux kernel version first
  struct utsname unameInfo;
  int errorFlag = uname(&unameInfo);
  if( errorFlag!=0 )
    {
    kwsys_ios::cout << "Problem calling uname(): " << strerror(errno) << kwsys_ios::endl;
    return false;
    }

  if( strlen(unameInfo.release)>=3 )
    {
    // release looks like "2.6.3-15mdk-i686-up-4GB"
    char majorChar=unameInfo.release[0];
    char minorChar=unameInfo.release[2];

    if( isdigit(majorChar) )
      {
      linuxMajor=majorChar-'0';
      }

    if( isdigit(minorChar) )
      {
      linuxMinor=minorChar-'0';
      }
    }

  FILE *fd = fopen("/proc/meminfo", "r" );
  if ( !fd )
    {
    kwsys_ios::cout << "Problem opening /proc/meminfo" << kwsys_ios::endl;
    return false;
    }

  if( linuxMajor>=3 || ( (linuxMajor>=2) && (linuxMinor>=6) ) )
    {
    // new /proc/meminfo format since kernel 2.6.x
    // Rigorously, this test should check from the developping version 2.5.x
    // that introduced the new format...

    enum { mMemTotal, mMemFree, mBuffers, mCached, mSwapTotal, mSwapFree };
    const char* format[6] =
      { "MemTotal:%lu kB", "MemFree:%lu kB", "Buffers:%lu kB",
        "Cached:%lu kB", "SwapTotal:%lu kB", "SwapFree:%lu kB" };
    bool have[6] = { false, false, false, false, false, false };
    unsigned long value[6];
    int count = 0;
    while(fgets(buffer, static_cast<int>(sizeof(buffer)), fd))
      {
      for(int i=0; i < 6; ++i)
        {
        if(!have[i] && sscanf(buffer, format[i], &value[i]) == 1)
          {
          have[i] = true;
          ++count;
          }
        }
      }
    if(count == 6)
      {
      this->TotalPhysicalMemory = value[mMemTotal] / 1024;
      this->AvailablePhysicalMemory =
        (value[mMemFree] + value[mBuffers] + value[mCached]) / 1024;
      this->TotalVirtualMemory = value[mSwapTotal] / 1024;
      this->AvailableVirtualMemory = value[mSwapFree] / 1024;
      }
    else
      {
      kwsys_ios::cout << "Problem parsing /proc/meminfo" << kwsys_ios::endl;
      fclose(fd);
      return false;
      }
    }
  else
    {
    // /proc/meminfo format for kernel older than 2.6.x

    unsigned long temp;
    unsigned long cachedMem;
    unsigned long buffersMem;
    // Skip "total: used:..."
    char *r=fgets(buffer, static_cast<int>(sizeof(buffer)), fd);
    int status=0;
    if(r==buffer)
      {
      status+=fscanf(fd, "Mem: %lu %lu %lu %lu %lu %lu\n",
                     &tp, &temp, &ap, &temp, &buffersMem, &cachedMem);
      }
    if(status==6)
      {
      status+=fscanf(fd, "Swap: %lu %lu %lu\n", &tv, &temp, &av);
      }
    if(status==9)
      {
      this->TotalVirtualMemory = tv>>10>>10;
      this->TotalPhysicalMemory = tp>>10>>10;
      this->AvailableVirtualMemory = av>>10>>10;
      this->AvailablePhysicalMemory = (ap+buffersMem+cachedMem)>>10>>10;
      }
    else
      {
      kwsys_ios::cout << "Problem parsing /proc/meminfo" << kwsys_ios::endl;
      fclose(fd);
      return false;
      }
    }
  fclose( fd );

  return true;
#else
  return false;
#endif
}